

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlLocationSetPtr xmlXPtrLocationSetMerge(xmlLocationSetPtr val1,xmlLocationSetPtr val2)

{
  int local_24;
  int i;
  xmlLocationSetPtr val2_local;
  xmlLocationSetPtr val1_local;
  
  if (val1 == (xmlLocationSetPtr)0x0) {
    val1_local = (xmlLocationSetPtr)0x0;
  }
  else {
    val1_local = val1;
    if (val2 != (xmlLocationSetPtr)0x0) {
      for (local_24 = 0; local_24 < val2->locNr; local_24 = local_24 + 1) {
        xmlXPtrLocationSetAdd(val1,val2->locTab[local_24]);
      }
    }
  }
  return val1_local;
}

Assistant:

xmlLocationSetPtr
xmlXPtrLocationSetMerge(xmlLocationSetPtr val1, xmlLocationSetPtr val2) {
    int i;

    if (val1 == NULL) return(NULL);
    if (val2 == NULL) return(val1);

    /*
     * !!!!! this can be optimized a lot, knowing that both
     *       val1 and val2 already have unicity of their values.
     */

    for (i = 0;i < val2->locNr;i++)
        xmlXPtrLocationSetAdd(val1, val2->locTab[i]);

    return(val1);
}